

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

QFunctionsDiscreteNonStationary *
AlphaVectorPlanning::ImportValueFunction(string *filename,size_t nr,size_t nrA,size_t nrS)

{
  ostream *this;
  ostream *__x;
  ulong in_RDX;
  string *in_RSI;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RDI;
  stringstream filenameT;
  Index t;
  QFunctionsDiscreteNonStationary *Q;
  string *in_stack_00000408;
  string local_218 [96];
  size_t in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffe58;
  uint local_30;
  
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
            *)0x90bc39);
  for (local_30 = 0; local_30 != in_RDX; local_30 = local_30 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe48);
    this = std::operator<<((ostream *)&stack0xfffffffffffffe58,in_RSI);
    __x = std::operator<<(this,"_t");
    std::ostream::operator<<(__x,local_30);
    std::__cxx11::stringstream::str();
    ImportValueFunction(in_stack_00000408);
    ValueFunctionToQ(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::push_back((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                 *)this,(value_type *)__x);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)in_RDI);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(in_RDI);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe48);
  }
  return (QFunctionsDiscreteNonStationary *)in_RDI;
}

Assistant:

QFunctionsDiscreteNonStationary
AlphaVectorPlanning::ImportValueFunction(const string & filename, size_t nr,
                                         size_t nrA, size_t nrS)
{
    QFunctionsDiscreteNonStationary Q;
    for(Index t=0;t!=nr;++t)
    {
        stringstream filenameT;
        filenameT << filename << "_t" << t;
        Q.push_back(ValueFunctionToQ(
                        ImportValueFunction(filenameT.str()),nrA,nrS));
    }
    return(Q);
}